

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O2

symtab * symtab_new(void)

{
  symtab *psVar1;
  int *piVar2;
  long lVar3;
  
  psVar1 = (symtab *)calloc(0x20,1);
  psVar1->bucketsnum = 0x7f;
  piVar2 = (int *)malloc(0x1fc);
  psVar1->buckets = piVar2;
  for (lVar3 = 0; lVar3 != 0x7f; lVar3 = lVar3 + 1) {
    piVar2[lVar3] = -1;
  }
  return psVar1;
}

Assistant:

struct symtab *symtab_new() {
	int i;
	struct symtab *res = calloc(sizeof *res, 1);
	res->bucketsnum = primes[0];
	res->buckets = malloc(sizeof *res->buckets * res->bucketsnum);
	for (i = 0; i < res->bucketsnum; i++)
		res->buckets[i] = -1;
	return res;
}